

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall
djb::microfacet::sample(microfacet *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf,void *user_args)

{
  float fVar1;
  _func_int **pp_Var2;
  impl *piVar3;
  long lVar4;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar5;
  _func_int **pp_Var6;
  args *paVar7;
  float_t fVar8;
  float_t fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  value_type vVar14;
  float_t *in_stack_00000008;
  value_type F;
  args args;
  vec3 local_e8;
  undefined4 uStack_dc;
  float *local_d8;
  vec3 local_d0;
  args local_c4;
  vec3 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_40;
  float local_38;
  
  if (wo_out->z <= 0.0) {
    if (pdf != (float_t *)0x0) {
      pdf[0] = 0.0;
      pdf[1] = 0.0;
      pdf[2] = 0.0;
    }
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this,u);
    pfVar5 = extraout_RDX;
  }
  else {
    local_d8 = (float *)user_args;
    if (in_stack_00000008 == (float_t *)0x0) {
      local_e8._0_8_ = (_func_int **)0x0;
      local_e8.z = 1.0;
      microfacet::args::normalmap(&local_c4,&local_e8,1.0,1.0,0.0);
    }
    else {
      paVar7 = &local_c4;
      for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
        (paVar7->mtra).r[0].x = *in_stack_00000008;
        in_stack_00000008 = in_stack_00000008 + 1;
        paVar7 = (args *)&(paVar7->mtra).r[0].y;
      }
    }
    local_78 = u2_to_h2((microfacet *)u,(vec2 *)wi,wo_out,&local_c4);
    fVar13 = wo_out->z * local_78.z + wo_out->x * local_78.x + wo_out->y * local_78.y;
    fVar12 = fVar13 + fVar13;
    local_d0.z = fVar12 * local_78.z - wo_out->z;
    local_d0.y = local_78.y * fVar12 - wo_out->y;
    local_d0.x = local_78.x * fVar12 - wo_out->x;
    fVar8 = gcd((microfacet *)u,&local_78,wo_out,&local_d0,&local_c4);
    (**(code **)(*(long *)u[1] + 0x20))(fVar13,&local_e8);
    pfVar5 = local_d8;
    if (pdf != (float_t *)0x0) {
      pdf[2] = local_d0.z;
      pdf[0] = local_d0.x;
      pdf[1] = local_d0.y;
    }
    if (local_d8 != (float *)0x0) {
      fVar9 = ndf((microfacet *)u,&local_78,&local_c4);
      fVar12 = wo_out->x;
      fVar13 = wo_out->y;
      fVar1 = wo_out->z;
      fVar11 = local_c4.minv.r[0].z * fVar1 +
               local_c4.minv.r[0].x * fVar12 + local_c4.minv.r[0].y * fVar13;
      fVar10 = local_c4.minv.r[1].z * fVar1 +
               local_c4.minv.r[1].x * fVar12 + local_c4.minv.r[1].y * fVar13;
      local_38 = fVar1 * local_c4.minv.r[2].z +
                 fVar12 * local_c4.minv.r[2].x + fVar13 * local_c4.minv.r[2].y;
      fVar12 = local_38 * local_38 + fVar11 * fVar11 + fVar10 * fVar10;
      if (fVar12 < 0.0) {
        local_58 = ZEXT416((uint)fVar11);
        local_68 = ZEXT416((uint)fVar10);
        fVar12 = sqrtf(fVar12);
        fVar10 = (float)local_68._0_4_;
        fVar11 = (float)local_58._0_4_;
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      fVar13 = 1.0 / fVar12;
      local_38 = local_38 * fVar13;
      local_40 = CONCAT44(fVar10 * fVar13,fVar11 * fVar13);
      fVar13 = (float)(**(code **)((long)*u + 0x50))(u);
      *pfVar5 = fVar9 / (fVar12 * fVar13 * 4.0);
    }
    (this->super_brdf)._vptr_brdf = (_func_int **)local_e8._0_8_;
    piVar3 = (impl *)operator_new(local_e8._0_8_ << 2);
    (this->m_fresnel).m_f = piVar3;
    pp_Var2 = (this->super_brdf)._vptr_brdf;
    if (pp_Var2 != (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x0;
      do {
        *(float *)((long)&piVar3->_vptr_impl + (long)pp_Var6 * 4) =
             *(float *)(CONCAT44(uStack_dc,local_e8.z) + (long)pp_Var6 * 4) * fVar8;
        pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
      } while (pp_Var2 != pp_Var6);
    }
    operator_delete((void *)CONCAT44(uStack_dc,local_e8.z));
    pfVar5 = extraout_RDX_00;
  }
  vVar14._M_data = pfVar5;
  vVar14._M_size = (size_t)this;
  return vVar14;
}

Assistant:

brdf::value_type
microfacet::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf,
	const void *user_args
) const {
	if (wi.z > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wm = u2_to_h2(u, wi, args);
		vec3 wo = h2_to_s2(wm, wi);
		float_t zd = dot(wi, wm);
		float_t Gcd = gcd(wm, wi, wo, args);
		brdf::value_type F = m_fresnel->eval(zd);

		if (wo_out) (*wo_out) = wo;
		if (pdf) (*pdf) = ndf(wm, args) / (4 * sigma(wi, args));

		return F * Gcd;
	} else {
		if (wo_out) (*wo_out) = vec3(0);
		if (pdf) (*pdf) = 0;

		return zero_value();
	}
}